

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O3

void __thiscall google::protobuf::UInt32Value::MergeFrom(UInt32Value *this,Message *from)

{
  LogMessage *other;
  LogMessage local_60;
  LogFinisher local_21;
  
  if ((UInt32Value *)from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/wrappers.pb.cc"
               ,0x594);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if ((from->super_MessageLite)._vptr_MessageLite == (_func_int **)&PTR__UInt32Value_003bdaf8) {
    MergeFrom(this,(UInt32Value *)from);
  }
  else {
    internal::ReflectionOps::Merge(from,&this->super_Message);
  }
  return;
}

Assistant:

void UInt32Value::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.UInt32Value)
  GOOGLE_DCHECK_NE(&from, this);
  const UInt32Value* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<UInt32Value>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.UInt32Value)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.UInt32Value)
    MergeFrom(*source);
  }
}